

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::detail::IEEEFloat::initFromFloatAPInt(IEEEFloat *this,APInt *api)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint64_t *puVar5;
  integerPart *piVar6;
  uint32_t mysignificand;
  uint32_t myexponent;
  uint32_t i;
  APInt *api_local;
  IEEEFloat *this_local;
  
  uVar2 = APInt::getBitWidth(api);
  if (uVar2 != 0x20) {
    __assert_fail("api.getBitWidth()==32",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc60,"void llvm::detail::IEEEFloat::initFromFloatAPInt(const APInt &)");
  }
  puVar5 = APInt::getRawData(api);
  uVar1 = *puVar5;
  uVar2 = (uint)uVar1 >> 0x17 & 0xff;
  uVar3 = (uint)uVar1 & 0x7fffff;
  initialize(this,(fltSemantics *)semIEEEsingle);
  uVar4 = partCount(this);
  if (uVar4 != 1) {
    __assert_fail("partCount()==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc66,"void llvm::detail::IEEEFloat::initFromFloatAPInt(const APInt &)");
  }
  this->field_0x12 = this->field_0x12 & 0xf7 | ((byte)(uVar1 >> 0x18) >> 7) << 3;
  if ((uVar2 == 0) && ((uVar1 & 0x7fffff) == 0)) {
    this->field_0x12 = this->field_0x12 & 0xf8 | 3;
  }
  else if ((uVar2 == 0xff) && ((uVar1 & 0x7fffff) == 0)) {
    this->field_0x12 = this->field_0x12 & 0xf8;
  }
  else if ((uVar2 == 0xff) && ((uVar1 & 0x7fffff) != 0)) {
    this->field_0x12 = this->field_0x12 & 0xf8 | 1;
    piVar6 = significandParts(this);
    *piVar6 = (ulong)uVar3;
  }
  else {
    this->field_0x12 = this->field_0x12 & 0xf8 | 2;
    this->exponent = (short)uVar2 + -0x7f;
    piVar6 = significandParts(this);
    *piVar6 = (ulong)uVar3;
    if (uVar2 == 0) {
      this->exponent = -0x7e;
    }
    else {
      piVar6 = significandParts(this);
      *piVar6 = *piVar6 | 0x800000;
    }
  }
  return;
}

Assistant:

void IEEEFloat::initFromFloatAPInt(const APInt &api) {
  assert(api.getBitWidth()==32);
  uint32_t i = (uint32_t)*api.getRawData();
  uint32_t myexponent = (i >> 23) & 0xff;
  uint32_t mysignificand = i & 0x7fffff;

  initialize(&semIEEEsingle);
  assert(partCount()==1);

  sign = i >> 31;
  if (myexponent==0 && mysignificand==0) {
    // exponent, significand meaningless
    category = fcZero;
  } else if (myexponent==0xff && mysignificand==0) {
    // exponent, significand meaningless
    category = fcInfinity;
  } else if (myexponent==0xff && mysignificand!=0) {
    // sign, exponent, significand meaningless
    category = fcNaN;
    *significandParts() = mysignificand;
  } else {
    category = fcNormal;
    exponent = myexponent - 127;  //bias
    *significandParts() = mysignificand;
    if (myexponent==0)    // denormal
      exponent = -126;
    else
      *significandParts() |= 0x800000; // integer bit
  }
}